

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stochastic.hxx
# Opt level: O0

void __thiscall
StochasticProcess::StochasticProcess(StochasticProcess *this,Time *time,string *name,string *type)

{
  string *type_local;
  string *name_local;
  Time *time_local;
  StochasticProcess *this_local;
  
  Parametric::Parametric(&this->super_Parametric,name,type);
  TimeDependent::TimeDependent(&this->super_TimeDependent,time);
  Physical::Physical(&this->super_Physical);
  (this->super_Parametric)._vptr_Parametric = (_func_int **)&PTR__StochasticProcess_0018ebb0;
  (this->super_TimeDependent)._vptr_TimeDependent = (_func_int **)&PTR__StochasticProcess_0018ec38;
  (this->super_Physical)._vptr_Physical = (_func_int **)&PTR__StochasticProcess_0018ec80;
  std::__cxx11::string::string((string *)&this->stochDescription);
  this->stochCurrentValue = 0.0;
  this->stochNextValue = 0.0;
  std::__cxx11::string::operator=((string *)&this->stochDescription,"stochastic process");
  this->stochNextStateIsPrepared = false;
  return;
}

Assistant:

StochasticProcess(class Time *time, const string& name="", const string& type="Stochastic") : Parametric(name, type), TimeDependent(time) { 
		stochCurrentValue = 0.0;
		stochNextValue = 0.0;
		stochDescription = "stochastic process";
		stochNextStateIsPrepared = false;
	}